

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.cpp
# Opt level: O1

void __thiscall
duckdb::Linenoise::EditCapitalizeNextWord(Linenoise *this,Capitalization capitalization)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  byte bVar5;
  
  uVar2 = this->pos;
  uVar1 = this->len;
  uVar3 = uVar2;
  if (uVar2 < uVar1) {
    do {
      uVar3 = uVar2;
      if ((0x20 < (ulong)(byte)this->buf[uVar2]) ||
         ((0x100002600U >> ((ulong)(byte)this->buf[uVar2] & 0x3f) & 1) == 0)) break;
      uVar2 = uVar2 + 1;
      uVar3 = uVar1;
    } while (uVar1 != uVar2);
  }
  if (uVar3 < this->len) {
    bVar4 = true;
    do {
      bVar5 = this->buf[uVar3];
      if (((ulong)bVar5 < 0x21) && ((0x100002600U >> ((ulong)bVar5 & 0x3f) & 1) != 0)) break;
      if (capitalization == UPPERCASE) {
        if ((byte)(bVar5 + 0x9f) < 0x1a) {
          bVar5 = bVar5 - 0x20;
LAB_00221d5b:
          this->buf[uVar3] = bVar5;
        }
      }
      else if (capitalization == LOWERCASE) {
        if ((byte)(bVar5 + 0xbf) < 0x1a) {
          bVar5 = bVar5 | 0x20;
          goto LAB_00221d5b;
        }
      }
      else if ((capitalization == CAPITALIZE) && (bVar4)) {
        if ((byte)(bVar5 + 0x9f) < 0x1a) {
          bVar5 = bVar5 - 0x20;
          bVar4 = false;
          goto LAB_00221d5b;
        }
        bVar4 = false;
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < this->len);
  }
  this->pos = uVar3;
  RefreshLine(this);
  return;
}

Assistant:

void Linenoise::EditCapitalizeNextWord(Capitalization capitalization) {
	size_t next_pos = pos;

	// find the next word
	while (next_pos < len && IsSpace(buf[next_pos])) {
		next_pos++;
	}
	bool first_char = true;
	while (next_pos < len && !IsSpace(buf[next_pos])) {
		switch (capitalization) {
		case Capitalization::CAPITALIZE: {
			if (first_char) {
				first_char = false;
				if (buf[next_pos] >= 'a' && buf[next_pos] <= 'z') {
					buf[next_pos] -= 'a' - 'A';
				}
			}
			break;
		}
		case Capitalization::LOWERCASE: {
			if (buf[next_pos] >= 'A' && buf[next_pos] <= 'Z') {
				buf[next_pos] += 'a' - 'A';
			}
			break;
		}
		case Capitalization::UPPERCASE: {
			if (buf[next_pos] >= 'a' && buf[next_pos] <= 'z') {
				buf[next_pos] -= 'a' - 'A';
			}
			break;
		}
		default:
			break;
		}
		next_pos++;
	}
	pos = next_pos;
	RefreshLine();
}